

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.hpp
# Opt level: O3

void __thiscall PFData::PFData(PFData *this)

{
  (this->m_filename)._M_dataplus._M_p = (pointer)&(this->m_filename).field_2;
  (this->m_filename)._M_string_length = 0;
  (this->m_filename).field_2._M_local_buf[0] = '\0';
  this->m_fp = (FILE *)0x0;
  this->m_Z = 0.0;
  this->m_Y = 0.0;
  this->m_X = 0.0;
  *(undefined8 *)((long)&this->m_X + 4) = 0;
  this->m_ny = 0;
  this->m_nx = 0;
  this->m_dZ = 1.0;
  this->m_dY = 1.0;
  this->m_dX = 1.0;
  this->m_numSubgrids = 0;
  this->m_r = 1;
  this->m_q = 1;
  this->m_p = 1;
  (this->m_indexOrder)._M_dataplus._M_p = (pointer)&(this->m_indexOrder).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_indexOrder,"zyx","");
  this->m_dataOwner = false;
  this->m_data = (double *)0x0;
  return;
}

Assistant:

PFData() = default;